

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

bool __thiscall QPDFAcroFormDocumentHelper::getNeedAppearances(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  QPDFObjectHandle acroform;
  allocator<char> local_49;
  undefined1 local_48 [48];
  
  QPDF::getRoot((QPDF *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"/AcroForm",&local_49);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&stack0xffffffffffffffe8,(string *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&stack0xffffffffffffffe8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_48 + 0x10),"/NeedAppearances",&local_49);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_48,(string *)&stack0xffffffffffffffe8);
    bVar1 = QPDFObjectHandle::isBool((QPDFObjectHandle *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__cxx11::string::~string((string *)(local_48 + 0x10));
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_48 + 0x10),"/NeedAppearances",&local_49);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_48,(string *)&stack0xffffffffffffffe8);
      bVar1 = QPDFObjectHandle::getBoolValue((QPDFObjectHandle *)local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
      std::__cxx11::string::~string((string *)(local_48 + 0x10));
      goto LAB_0014550f;
    }
  }
  bVar1 = false;
LAB_0014550f:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return bVar1;
}

Assistant:

bool
QPDFAcroFormDocumentHelper::getNeedAppearances()
{
    bool result = false;
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (acroform.isDictionary() && acroform.getKey("/NeedAppearances").isBool()) {
        result = acroform.getKey("/NeedAppearances").getBoolValue();
    }
    return result;
}